

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintDeclarationSyntax *syntax)

{
  Token *pTVar1;
  Compilation *args;
  ScopedNameSyntax *name;
  size_t sVar2;
  pointer pTVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined2 uVar4;
  ConstraintBlockSymbol *this;
  Diagnostic *this_00;
  long lVar5;
  SymbolIndex index;
  SourceRange SVar6;
  Token qual;
  Token nameToken;
  Token local_58;
  SourceLocation local_40;
  Token local_38;
  
  args = scope->compilation;
  name = (ScopedNameSyntax *)(syntax->name).ptr;
  if ((name->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName) {
    if (scope->lastMember == (Symbol *)0x0) {
      index = 1;
    }
    else {
      index = scope->lastMember->indexInScope + 1;
    }
    Compilation::addOutOfBlockDecl(args,scope,name,(SyntaxNode *)syntax,index);
    this = (ConstraintBlockSymbol *)0x0;
  }
  else {
    if (scope->thisSym->kind != ClassType) {
      SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      Scope::addDiag(scope,(DiagCode)0x200006,SVar6);
    }
    local_38 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(syntax->name).ptr);
    local_58 = (Token)parsing::Token::valueText(&local_38);
    local_40 = parsing::Token::location(&local_38);
    this = BumpAllocator::
           emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&args->super_BumpAllocator,args,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_58,&local_40);
    (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
    sVar2 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent
            ._M_extent_value;
    if (sVar2 != 0) {
      pTVar3 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr
      ;
      lVar5 = 0;
      do {
        pTVar1 = (Token *)((long)&pTVar3->kind + lVar5);
        uVar4 = pTVar1->kind;
        local_58 = *pTVar1;
        if (uVar4 == StaticKeyword) {
          (this->flags).m_bits = (this->flags).m_bits | 4;
        }
        else if ((uVar4 == ExternKeyword) || (uVar4 == PureKeyword)) {
          SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->block).ptr);
          this_00 = Scope::addDiag(scope,(DiagCode)0xa40007,SVar6);
          SVar6 = parsing::Token::range(&local_58);
          Diagnostic::operator<<(this_00,SVar6);
          break;
        }
        lVar5 = lVar5 + 0x10;
      } while (sVar2 << 4 != lVar5);
    }
    addSpecifierFlags(&syntax->specifiers,&this->flags);
    if ((((this->flags).m_bits & 4) == 0) &&
       ((((Type *)scope->thisSym)->super_Symbol).kind == ClassType)) {
      addThisVar(this,(Type *)scope->thisSym);
    }
  }
  return this;
}

Assistant:

ConstraintBlockSymbol* ConstraintBlockSymbol::fromSyntax(
    const Scope& scope, const ConstraintDeclarationSyntax& syntax) {

    auto& comp = scope.getCompilation();
    if (syntax.name->kind == SyntaxKind::ScopedName) {
        // Remember the location in the parent scope where we *would* have inserted this
        // constraint, for later use during lookup.
        uint32_t index = 1;
        if (auto last = scope.getLastMember())
            index = (uint32_t)last->getIndex() + 1;

        comp.addOutOfBlockDecl(scope, syntax.name->as<ScopedNameSyntax>(), syntax,
                               SymbolIndex(index));
        return nullptr;
    }

    if (scope.asSymbol().kind != SymbolKind::ClassType)
        scope.addDiag(diag::ConstraintNotInClass, syntax.sourceRange());

    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    // Static is the only allowed qualifier.
    for (auto qual : syntax.qualifiers) {
        if (qual.kind == TokenKind::StaticKeyword)
            result->flags |= ConstraintBlockFlags::Static;
        else if (qual.kind == TokenKind::PureKeyword || qual.kind == TokenKind::ExternKeyword) {
            // This is an error, pure and extern declarations can't declare bodies.
            scope.addDiag(diag::UnexpectedConstraintBlock, syntax.block->sourceRange())
                << qual.range();
            break;
        }
    }

    addSpecifierFlags(syntax.specifiers, result->flags);

    if (!result->flags.has(ConstraintBlockFlags::Static) &&
        scope.asSymbol().kind == SymbolKind::ClassType) {
        result->addThisVar(scope.asSymbol().as<ClassType>());
    }

    return result;
}